

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_and_ping(void)

{
  int iVar1;
  __uid_t _Var2;
  uint uVar3;
  int extraout_EAX;
  undefined8 uVar4;
  undefined1 *puVar5;
  anon_union_8_2_13e1ed65_for_data aVar6;
  uv_exit_cb p_Var7;
  uv_process_options_t *puVar8;
  passwd *ppVar9;
  int *piVar10;
  ulong uVar11;
  uv_process_options_t *__ptr;
  ulong uVar12;
  uv_buf_t *buf;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *__s;
  uv_process_options_t *puVar13;
  undefined1 auVar14 [16];
  int64_t eval_b;
  int64_t eval_b_2;
  uv_write_t write_req;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  uv_pipe_t in;
  undefined1 auStack_11f0 [48];
  uv_handle_t *apuStack_11c0 [11];
  uv_loop_t *puStack_1168;
  undefined8 auStack_1000 [29];
  uv_stdio_container_t uStack_f18;
  undefined4 uStack_f08;
  undefined4 uStack_ef8;
  anon_union_8_2_13e1ed65_for_data aStack_ee0;
  long lStack_ea8;
  int iStack_ea0;
  int iStack_e9c;
  undefined1 auStack_e98 [16];
  undefined8 uStack_e88;
  undefined2 uStack_e80;
  uv_stdio_container_t uStack_e78;
  long alStack_e68 [25];
  long alStack_da0 [25];
  uv_exit_cb ap_Stack_cd8 [29];
  undefined1 auStack_bf0 [88];
  int iStack_b98;
  anon_union_8_2_13e1ed65_for_data aStack_a30;
  uv_process_options_t *puStack_a28;
  long lStack_a20;
  long lStack_a18;
  anon_union_8_2_13e1ed65_for_data aStack_a10;
  char cStack_9f9;
  long lStack_9f8;
  long lStack_9f0;
  anon_union_8_2_13e1ed65_for_data aStack_9e8;
  uv_process_options_t *puStack_9e0;
  uv_process_options_t *apuStack_9d8 [2];
  uv_process_options_t *puStack_9c8;
  cpu_set_t cStack_9c0;
  anon_union_8_2_13e1ed65_for_data aStack_938;
  char *pcStack_930;
  uv_process_options_t *puStack_928;
  uv_process_options_t *puStack_920;
  long lStack_918;
  long lStack_910;
  anon_union_8_2_13e1ed65_for_data aStack_908;
  long lStack_900;
  long lStack_8f8;
  anon_union_8_2_13e1ed65_for_data aStack_8f0;
  long lStack_8e8;
  long lStack_8e0;
  char acStack_8ca [10];
  anon_union_8_2_13e1ed65_for_data aStack_8c0;
  sigset_t sStack_890;
  anon_union_8_2_13e1ed65_for_data aStack_810;
  long lStack_808;
  long lStack_800;
  undefined1 auStack_7f8 [16];
  uv_stdio_container_t auStack_7e8 [2];
  long alStack_7c0 [25];
  undefined1 auStack_6f8 [232];
  undefined1 *puStack_610;
  anon_union_8_2_13e1ed65_for_data aStack_608;
  long lStack_5f8;
  long lStack_5f0;
  undefined1 auStack_5e8 [16];
  long alStack_5d8 [25];
  uv_stdio_container_t uStack_510;
  undefined4 uStack_500;
  undefined1 *puStack_4f8;
  undefined1 auStack_4e0 [232];
  undefined1 auStack_3f8 [232];
  undefined1 *puStack_310;
  anon_union_8_2_13e1ed65_for_data aStack_308;
  uv_process_options_t *puStack_300;
  long local_2f0;
  long local_2e8;
  undefined1 local_2e0 [16];
  long local_2d0 [25];
  uv_stdio_container_t local_208;
  undefined4 local_1f8;
  undefined1 *local_1f0;
  undefined1 local_1e8 [232];
  undefined1 local_100 [232];
  
  puStack_300 = (uv_process_options_t *)0x1c15cc;
  init_process_options("spawn_helper3",exit_cb);
  puStack_300 = (uv_process_options_t *)0x1c15dd;
  local_2e0 = uv_buf_init("TEST",4);
  puStack_300 = (uv_process_options_t *)0x1c15ec;
  uVar4 = uv_default_loop();
  puVar5 = local_1e8;
  puStack_300 = (uv_process_options_t *)0x1c1601;
  uv_pipe_init(uVar4,puVar5,0);
  puStack_300 = (uv_process_options_t *)0x1c1606;
  uVar4 = uv_default_loop();
  puStack_300 = (uv_process_options_t *)0x1c161b;
  uv_pipe_init(uVar4,(uv_stream_t *)local_100,0);
  options.stdio = &local_208;
  local_208.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_1f8 = 0x21;
  options.stdio_count = 2;
  puStack_300 = (uv_process_options_t *)0x1c1655;
  local_208.data.stream = (uv_stream_t *)local_100;
  local_1f0 = puVar5;
  uVar4 = uv_default_loop();
  puStack_300 = (uv_process_options_t *)0x1c1667;
  iVar1 = uv_spawn(uVar4,&process,&options);
  local_2d0[0] = (long)iVar1;
  local_2f0 = 0;
  if (local_2d0[0] == 0) {
    puStack_300 = (uv_process_options_t *)0x1c1695;
    iVar1 = uv_process_kill(&process,0);
    local_2d0[0] = (long)iVar1;
    local_2f0 = 0;
    if (local_2d0[0] != 0) goto LAB_001c1852;
    puStack_300 = (uv_process_options_t *)0x1c16d8;
    iVar1 = uv_write(local_2d0,local_100,local_2e0,1,write_cb);
    local_2f0 = (long)iVar1;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001c1861;
    puStack_300 = (uv_process_options_t *)0x1c1713;
    iVar1 = uv_read_start(local_1e8,on_alloc,on_read);
    local_2f0 = (long)iVar1;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001c1870;
    local_2f0 = (long)exit_cb_called;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001c187f;
    puStack_300 = (uv_process_options_t *)0x1c175d;
    uVar4 = uv_default_loop();
    puStack_300 = (uv_process_options_t *)0x1c1767;
    iVar1 = uv_run(uVar4,0);
    local_2f0 = (long)iVar1;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001c188e;
    local_2f0 = 1;
    local_2e8 = (long)exit_cb_called;
    if (local_2e8 != 1) goto LAB_001c189d;
    puStack_300 = (uv_process_options_t *)0x1c17bf;
    iVar1 = strcmp(output,"TEST");
    local_2f0 = (long)iVar1;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001c18ac;
    puStack_300 = (uv_process_options_t *)0x1c17e4;
    puVar5 = (undefined1 *)uv_default_loop();
    puStack_300 = (uv_process_options_t *)0x1c17f8;
    uv_walk(puVar5,close_walk_cb,0);
    puStack_300 = (uv_process_options_t *)0x1c1802;
    uv_run(puVar5,0);
    local_2f0 = 0;
    puStack_300 = (uv_process_options_t *)0x1c1810;
    uVar4 = uv_default_loop();
    puStack_300 = (uv_process_options_t *)0x1c1818;
    iVar1 = uv_loop_close(uVar4);
    local_2e8 = (long)iVar1;
    if (local_2f0 == local_2e8) {
      puStack_300 = (uv_process_options_t *)0x1c1834;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_300 = (uv_process_options_t *)0x1c1852;
    run_test_spawn_and_ping_cold_1();
LAB_001c1852:
    puStack_300 = (uv_process_options_t *)0x1c1861;
    run_test_spawn_and_ping_cold_2();
LAB_001c1861:
    puStack_300 = (uv_process_options_t *)0x1c1870;
    run_test_spawn_and_ping_cold_3();
LAB_001c1870:
    puStack_300 = (uv_process_options_t *)0x1c187f;
    run_test_spawn_and_ping_cold_4();
LAB_001c187f:
    puStack_300 = (uv_process_options_t *)0x1c188e;
    run_test_spawn_and_ping_cold_5();
LAB_001c188e:
    puStack_300 = (uv_process_options_t *)0x1c189d;
    run_test_spawn_and_ping_cold_6();
LAB_001c189d:
    puStack_300 = (uv_process_options_t *)0x1c18ac;
    run_test_spawn_and_ping_cold_7();
LAB_001c18ac:
    puStack_300 = (uv_process_options_t *)0x1c18bb;
    run_test_spawn_and_ping_cold_8();
  }
  puStack_300 = (uv_process_options_t *)run_test_spawn_same_stdout_stderr;
  run_test_spawn_and_ping_cold_9();
  puStack_300 = &options;
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c18e9;
  puStack_310 = puVar5;
  aStack_308.stream = (uv_stream_t *)local_100;
  init_process_options("spawn_helper3",exit_cb);
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c18fa;
  auStack_5e8 = uv_buf_init("TEST",4);
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1909;
  uVar4 = uv_default_loop();
  puVar5 = auStack_4e0;
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c191e;
  uv_pipe_init(uVar4,puVar5,0);
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1923;
  uVar4 = uv_default_loop();
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1938;
  uv_pipe_init(uVar4,(uv_stream_t *)auStack_3f8,0);
  options.stdio = &uStack_510;
  puVar13 = &options;
  uStack_510.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_500 = 0x21;
  options.stdio_count = 2;
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1972;
  uStack_510.data.stream = (uv_stream_t *)auStack_3f8;
  puStack_4f8 = puVar5;
  uVar4 = uv_default_loop();
  aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1984;
  iVar1 = uv_spawn(uVar4,&process,&options);
  alStack_5d8[0] = (long)iVar1;
  lStack_5f8 = 0;
  if (alStack_5d8[0] == 0) {
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c19b2;
    iVar1 = uv_process_kill(&process,0);
    alStack_5d8[0] = (long)iVar1;
    lStack_5f8 = 0;
    if (alStack_5d8[0] != 0) goto LAB_001c1b6f;
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c19f5;
    iVar1 = uv_write(alStack_5d8,auStack_3f8,auStack_5e8,1,write_cb);
    lStack_5f8 = (long)iVar1;
    lStack_5f0 = 0;
    if (lStack_5f8 != 0) goto LAB_001c1b7e;
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1a30;
    iVar1 = uv_read_start(auStack_4e0,on_alloc,on_read);
    lStack_5f8 = (long)iVar1;
    lStack_5f0 = 0;
    if (lStack_5f8 != 0) goto LAB_001c1b8d;
    lStack_5f8 = (long)exit_cb_called;
    lStack_5f0 = 0;
    if (lStack_5f8 != 0) goto LAB_001c1b9c;
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1a7a;
    uVar4 = uv_default_loop();
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1a84;
    iVar1 = uv_run(uVar4,0);
    lStack_5f8 = (long)iVar1;
    lStack_5f0 = 0;
    if (lStack_5f8 != 0) goto LAB_001c1bab;
    lStack_5f8 = 1;
    lStack_5f0 = (long)exit_cb_called;
    if (lStack_5f0 != 1) goto LAB_001c1bba;
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1adc;
    iVar1 = strcmp(output,"TEST");
    lStack_5f8 = (long)iVar1;
    lStack_5f0 = 0;
    if (lStack_5f8 != 0) goto LAB_001c1bc9;
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b01;
    puVar5 = (undefined1 *)uv_default_loop();
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b15;
    uv_walk(puVar5,close_walk_cb,0);
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b1f;
    uv_run(puVar5,0);
    lStack_5f8 = 0;
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b2d;
    uVar4 = uv_default_loop();
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b35;
    iVar1 = uv_loop_close(uVar4);
    lStack_5f0 = (long)iVar1;
    if (lStack_5f8 == lStack_5f0) {
      aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b51;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b6f;
    run_test_spawn_same_stdout_stderr_cold_1();
LAB_001c1b6f:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b7e;
    run_test_spawn_same_stdout_stderr_cold_2();
LAB_001c1b7e:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b8d;
    run_test_spawn_same_stdout_stderr_cold_3();
LAB_001c1b8d:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1b9c;
    run_test_spawn_same_stdout_stderr_cold_4();
LAB_001c1b9c:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1bab;
    run_test_spawn_same_stdout_stderr_cold_5();
LAB_001c1bab:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1bba;
    run_test_spawn_same_stdout_stderr_cold_6();
LAB_001c1bba:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1bc9;
    run_test_spawn_same_stdout_stderr_cold_7();
LAB_001c1bc9:
    aStack_608 = (anon_union_8_2_13e1ed65_for_data)0x1c1bd8;
    run_test_spawn_same_stdout_stderr_cold_8();
  }
  aStack_608.stream = (uv_stream_t *)run_test_spawn_closed_process_io;
  run_test_spawn_same_stdout_stderr_cold_9();
  aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c04;
  puStack_610 = puVar5;
  aStack_608.stream = (uv_stream_t *)auStack_3f8;
  init_process_options("spawn_helper3",exit_cb);
  aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c09;
  uVar4 = uv_default_loop();
  aVar6.stream = (uv_stream_t *)auStack_6f8;
  aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c1e;
  uv_pipe_init(uVar4,aVar6.stream,0);
  options.stdio = auStack_7e8;
  __s = &options;
  auStack_7e8[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c4c;
  auStack_7e8[0].data.stream = aVar6.stream;
  close(0);
  aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c51;
  uVar4 = uv_default_loop();
  aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c63;
  iVar1 = uv_spawn(uVar4,&process,&options);
  alStack_7c0[0] = (long)iVar1;
  auStack_7f8._0_8_ = 0;
  if (alStack_7c0[0] == 0) {
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1c94;
    auStack_7f8 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1cc1;
    iVar1 = uv_write(alStack_7c0,auStack_6f8,auStack_7f8,1,write_cb);
    lStack_800 = (long)iVar1;
    lStack_808 = 0;
    if (lStack_800 != 0) goto LAB_001c1dbd;
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1ce4;
    uVar4 = uv_default_loop();
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1cee;
    iVar1 = uv_run(uVar4,0);
    lStack_800 = (long)iVar1;
    lStack_808 = 0;
    if (lStack_800 != 0) goto LAB_001c1dca;
    lStack_800 = 1;
    lStack_808 = (long)exit_cb_called;
    if (lStack_808 != 1) goto LAB_001c1dd7;
    lStack_800 = 2;
    lStack_808 = (long)close_cb_called;
    if (lStack_808 != 2) goto LAB_001c1de4;
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1d57;
    aVar6.stream = (uv_stream_t *)uv_default_loop();
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1d6b;
    uv_walk(aVar6.stream,close_walk_cb,0);
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1d75;
    uv_run(aVar6.stream,0);
    lStack_800 = 0;
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1d83;
    uVar4 = uv_default_loop();
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1d8b;
    iVar1 = uv_loop_close(uVar4);
    lStack_808 = (long)iVar1;
    if (lStack_800 == lStack_808) {
      aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1da1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1dbd;
    run_test_spawn_closed_process_io_cold_1();
LAB_001c1dbd:
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1dca;
    run_test_spawn_closed_process_io_cold_2();
LAB_001c1dca:
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1dd7;
    run_test_spawn_closed_process_io_cold_3();
LAB_001c1dd7:
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1de4;
    run_test_spawn_closed_process_io_cold_4();
LAB_001c1de4:
    aStack_810 = (anon_union_8_2_13e1ed65_for_data)0x1c1df1;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_810.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  aStack_810 = aVar6;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_890);
  sigaddset(&sStack_890,0xf);
  iVar1 = pthread_sigmask(0,&sStack_890,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    sStack_890.__val[0] = 0xffffffffffffffff;
    p_Var7 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x1);
    if ((uv_exit_cb)sStack_890.__val[0] == p_Var7) goto LAB_001c2067;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    sStack_890.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_890.__val[0] != (uv_exit_cb)0x0) goto LAB_001c2074;
    sigemptyset(&sStack_890);
    sigaddset(&sStack_890,0xf);
    iVar1 = pthread_sigmask(1,&sStack_890,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_001c2081;
    sStack_890.__val[0] = 0xffffffffffffffff;
    p_Var7 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x0);
    if ((uv_exit_cb)sStack_890.__val[0] == p_Var7) goto LAB_001c208e;
    iVar1 = uv_kill(process.pid,0);
    sStack_890.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_890.__val[0] != (uv_exit_cb)0x0) goto LAB_001c209b;
    iVar1 = uv_kill(process.pid,0xf);
    sStack_890.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_890.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20a8;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    sStack_890.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_890.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20b5;
    sStack_890.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001c20c2;
    sStack_890.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001c20cf;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar8,close_walk_cb,0);
    uv_run(puVar8,0);
    sStack_890.__val[0] = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if ((uv_exit_cb)sStack_890.__val[0] == (uv_exit_cb)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001c2067:
    run_test_kill_cold_11();
LAB_001c2074:
    run_test_kill_cold_2();
LAB_001c2081:
    run_test_kill_cold_3();
LAB_001c208e:
    run_test_kill_cold_10();
LAB_001c209b:
    run_test_kill_cold_4();
LAB_001c20a8:
    run_test_kill_cold_5();
LAB_001c20b5:
    run_test_kill_cold_6();
LAB_001c20c2:
    run_test_kill_cold_7();
LAB_001c20cf:
    puVar8 = (uv_process_options_t *)&sStack_890;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c20f9;
  aStack_8c0 = (anon_union_8_2_13e1ed65_for_data)puVar8;
  _Var2 = getuid();
  if (_Var2 != 0) {
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22b8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2114;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2120;
  ppVar9 = getpwnam("nobody");
  if (ppVar9 == (passwd *)0x0) {
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22cb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22cb:
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22d8;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c22d8:
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22e5;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c22e5:
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22f2;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c22f2:
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22ff;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar9->pw_uid;
    puVar8 = &options;
    options.gid = ppVar9->pw_gid;
    puVar13 = (uv_process_options_t *)0x1e6b28;
    unaff_R12 = acStack_8ca;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2168;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar9->pw_uid);
    __s = (uv_process_options_t *)&stack0xfffffffffffff72c;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2183;
    snprintf((char *)__s,10,"%d",(ulong)ppVar9->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)__s;
    options.flags = 3;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21a8;
    uVar4 = uv_default_loop();
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21ba;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 == -0xd) {
      aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22bf;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_8e0 = (long)iVar1;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_001c22cb;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21e6;
    uVar4 = uv_default_loop();
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21f0;
    iVar1 = uv_run(uVar4,0);
    lStack_8e0 = (long)iVar1;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_001c22d8;
    lStack_8e0 = 1;
    lStack_8e8 = (long)exit_cb_called;
    if (lStack_8e8 != 1) goto LAB_001c22e5;
    lStack_8e0 = 1;
    lStack_8e8 = (long)close_cb_called;
    if (lStack_8e8 != 1) goto LAB_001c22f2;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2259;
    __s = (uv_process_options_t *)uv_default_loop();
    puVar8 = (uv_process_options_t *)0x0;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c226f;
    uv_walk(__s,close_walk_cb,0);
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2279;
    uv_run(__s,0);
    lStack_8e0 = 0;
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2287;
    uVar4 = uv_default_loop();
    aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c228f;
    iVar1 = uv_loop_close(uVar4);
    lStack_8e8 = (long)iVar1;
    if (lStack_8e0 == lStack_8e8) {
      aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22a5;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_8f0.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2316;
  aStack_8f0 = (anon_union_8_2_13e1ed65_for_data)puVar8;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2326;
    aVar6.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar6.stream == (uv_stream_t *)0x0) goto LAB_001c24b5;
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c233a;
    iVar1 = setgid(*(__gid_t *)&(aVar6.stream)->field_0x14);
    lStack_8f8 = (long)iVar1;
    lStack_900 = 0;
    puVar8 = (uv_process_options_t *)aVar6.stream;
    if (lStack_8f8 != 0) goto LAB_001c24ba;
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2360;
    iVar1 = setuid((aVar6.stream)->type);
    lStack_8f8 = (long)iVar1;
    lStack_900 = 0;
    if (lStack_8f8 == 0) goto LAB_001c237e;
  }
  else {
LAB_001c237e:
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2391;
    init_process_options("spawn_helper1",fail_cb);
    puVar8 = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c23ae;
    uVar4 = uv_default_loop();
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c23c0;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_8f8 = (long)iVar1;
    lStack_900 = -1;
    if (lStack_8f8 == -1) {
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c23e3;
      uVar4 = uv_default_loop();
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c23ed;
      iVar1 = uv_run(uVar4,0);
      lStack_8f8 = (long)iVar1;
      lStack_900 = 0;
      if (lStack_8f8 != 0) goto LAB_001c248e;
      lStack_8f8 = (long)close_cb_called;
      lStack_900 = 0;
      if (lStack_8f8 != 0) goto LAB_001c249b;
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c242f;
      puVar8 = (uv_process_options_t *)uv_default_loop();
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2443;
      uv_walk(puVar8,close_walk_cb,0);
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c244d;
      uv_run(puVar8,0);
      lStack_8f8 = 0;
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c245b;
      uVar4 = uv_default_loop();
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2463;
      iVar1 = uv_loop_close(uVar4);
      lStack_900 = (long)iVar1;
      if (lStack_8f8 == lStack_900) {
        aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c2479;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c248e;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c248e:
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c249b;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c249b:
      aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c24a8;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c24b5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24b5:
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c24ba;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ba:
    aStack_908 = (anon_union_8_2_13e1ed65_for_data)0x1c24c7;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_908.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_920 = (uv_process_options_t *)0x1c24de;
  aStack_908 = (anon_union_8_2_13e1ed65_for_data)puVar8;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_920 = (uv_process_options_t *)0x1c24ee;
    aVar6.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar6.stream == (uv_stream_t *)0x0) goto LAB_001c267d;
    puStack_920 = (uv_process_options_t *)0x1c2502;
    iVar1 = setgid(*(__gid_t *)&(aVar6.stream)->field_0x14);
    lStack_910 = (long)iVar1;
    lStack_918 = 0;
    puVar8 = (uv_process_options_t *)aVar6.stream;
    if (lStack_910 != 0) goto LAB_001c2682;
    puStack_920 = (uv_process_options_t *)0x1c2528;
    iVar1 = setuid((aVar6.stream)->type);
    lStack_910 = (long)iVar1;
    lStack_918 = 0;
    if (lStack_910 == 0) goto LAB_001c2546;
  }
  else {
LAB_001c2546:
    puStack_920 = (uv_process_options_t *)0x1c2559;
    init_process_options("spawn_helper1",fail_cb);
    puVar8 = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_920 = (uv_process_options_t *)0x1c2576;
    uVar4 = uv_default_loop();
    puStack_920 = (uv_process_options_t *)0x1c2588;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_910 = (long)iVar1;
    lStack_918 = -1;
    if (lStack_910 == -1) {
      puStack_920 = (uv_process_options_t *)0x1c25ab;
      uVar4 = uv_default_loop();
      puStack_920 = (uv_process_options_t *)0x1c25b5;
      iVar1 = uv_run(uVar4,0);
      lStack_910 = (long)iVar1;
      lStack_918 = 0;
      if (lStack_910 != 0) goto LAB_001c2656;
      lStack_910 = (long)close_cb_called;
      lStack_918 = 0;
      if (lStack_910 != 0) goto LAB_001c2663;
      puStack_920 = (uv_process_options_t *)0x1c25f7;
      puVar8 = (uv_process_options_t *)uv_default_loop();
      puStack_920 = (uv_process_options_t *)0x1c260b;
      uv_walk(puVar8,close_walk_cb,0);
      puStack_920 = (uv_process_options_t *)0x1c2615;
      uv_run(puVar8,0);
      lStack_910 = 0;
      puStack_920 = (uv_process_options_t *)0x1c2623;
      uVar4 = uv_default_loop();
      puStack_920 = (uv_process_options_t *)0x1c262b;
      iVar1 = uv_loop_close(uVar4);
      lStack_918 = (long)iVar1;
      if (lStack_910 == lStack_918) {
        puStack_920 = (uv_process_options_t *)0x1c2641;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_920 = (uv_process_options_t *)0x1c2656;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2656:
      puStack_920 = (uv_process_options_t *)0x1c2663;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2663:
      puStack_920 = (uv_process_options_t *)0x1c2670;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_920 = (uv_process_options_t *)0x1c267d;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c267d:
    puStack_920 = (uv_process_options_t *)0x1c2682;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c2682:
    puStack_920 = (uv_process_options_t *)0x1c268f;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_920 = (uv_process_options_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c26af;
  aStack_938 = (anon_union_8_2_13e1ed65_for_data)puVar8;
  pcStack_930 = unaff_R12;
  puStack_928 = __s;
  puStack_920 = puVar13;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28a4;
    run_test_spawn_affinity_cold_1();
LAB_001c28a4:
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28b1;
    run_test_spawn_affinity_cold_2();
LAB_001c28b1:
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28be;
    run_test_spawn_affinity_cold_3();
LAB_001c28be:
    __ptr = puVar8;
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28c3;
    run_test_spawn_affinity_cold_9();
LAB_001c28c3:
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28c8;
    run_test_spawn_affinity_cold_4();
LAB_001c28c8:
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28cd;
    run_test_spawn_affinity_cold_5();
LAB_001c28cd:
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28d2;
    run_test_spawn_affinity_cold_6();
LAB_001c28d2:
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28d7;
    run_test_spawn_affinity_cold_7();
  }
  else {
    puVar8._4_4_ = 0;
    puVar8._0_4_ = uVar3;
    cStack_9c0.__bits[0xe] = 0;
    cStack_9c0.__bits[0xf] = 0;
    cStack_9c0.__bits[0xc] = 0;
    cStack_9c0.__bits[0xd] = 0;
    cStack_9c0.__bits[10] = 0;
    cStack_9c0.__bits[0xb] = 0;
    cStack_9c0.__bits[8] = 0;
    cStack_9c0.__bits[9] = 0;
    cStack_9c0.__bits[6] = 0;
    cStack_9c0.__bits[7] = 0;
    cStack_9c0.__bits[4] = 0;
    cStack_9c0.__bits[5] = 0;
    cStack_9c0.__bits[2] = 0;
    cStack_9c0.__bits[3] = 0;
    cStack_9c0.__bits[0] = 0;
    cStack_9c0.__bits[1] = 0;
    __s = (uv_process_options_t *)0x0;
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c26ef;
    iVar1 = sched_getaffinity(0,0x80,&cStack_9c0);
    if (iVar1 != 0) {
      aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c26f8;
      piVar10 = __errno_location();
      __s = (uv_process_options_t *)(long)*piVar10;
    }
    puStack_9e0 = (uv_process_options_t *)0x0;
    apuStack_9d8[0] = __s;
    if (__s != (uv_process_options_t *)0x0) goto LAB_001c28a4;
    uVar12 = 1;
    if (1 < (int)uVar3) {
      uVar12 = (ulong)uVar3;
    }
    uVar11 = 0;
    do {
      if ((uVar11 < 0x400) && ((cStack_9c0.__bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
      goto LAB_001c2748;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    uVar11 = (ulong)uVar3;
LAB_001c2748:
    __s = (uv_process_options_t *)(uVar11 & 0xffffffff);
    puVar13 = (uv_process_options_t *)(ulong)uVar3;
    puStack_9e0 = puVar13;
    apuStack_9d8[0] = __s;
    if (puVar13 <= __s) goto LAB_001c28b1;
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2784;
    snprintf((char *)apuStack_9d8,0xb,"%d",__s);
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2797;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c27a4;
    __ptr = (uv_process_options_t *)calloc((size_t)puVar13,1);
    if ((uv_stream_t *)__ptr == (uv_stream_t *)0x0) goto LAB_001c28be;
    *(char *)((long)&__s->exit_cb + (long)&((uv_stream_t *)__ptr)->data) = '\x01';
    __s = &options;
    options.cpumask = (char *)__ptr;
    options.cpumask_size = (size_t)puVar13;
    options.args[2] = (char *)apuStack_9d8;
    options.args[3] = "dummy";
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c27ec;
    uVar4 = uv_default_loop();
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c27fe;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != 0) goto LAB_001c28c3;
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c280b;
    uVar4 = uv_default_loop();
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2815;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_001c28c8;
    if (exit_cb_called != 1) goto LAB_001c28cd;
    if (close_cb_called != 1) goto LAB_001c28d2;
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c283f;
    free(__ptr);
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2844;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2858;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2862;
    uv_run(__ptr,0);
    puStack_9e0 = (uv_process_options_t *)0x0;
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c286f;
    uVar4 = uv_default_loop();
    aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2877;
    iVar1 = uv_loop_close(uVar4);
    puStack_9c8 = (uv_process_options_t *)(long)iVar1;
    if (puStack_9e0 == puStack_9c8) {
      aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)0x1c288e;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_9e8.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c28ee;
  aStack_9e8 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c29ad;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29ad:
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c29b2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29b2:
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c29b7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2909;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_9f9;
    cStack_9f9 = '\0';
    options.cpumask_size = 0;
    __ptr = &options;
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c292f;
    uVar4 = uv_default_loop();
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2941;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != -0x16) goto LAB_001c29ad;
    if (exit_cb_called != 0) goto LAB_001c29b2;
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2954;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2968;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2972;
    uv_run(__ptr,0);
    lStack_9f0 = 0;
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2980;
    uVar4 = uv_default_loop();
    aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c2988;
    iVar1 = uv_loop_close(uVar4);
    lStack_9f8 = (long)iVar1;
    if (lStack_9f0 == lStack_9f8) {
      aStack_a10 = (anon_union_8_2_13e1ed65_for_data)0x1c29a0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_a10.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_a28 = (uv_process_options_t *)0x1c29d9;
  aStack_a10 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_a28 = (uv_process_options_t *)0x1c29de;
  uVar4 = uv_default_loop();
  puStack_a28 = (uv_process_options_t *)0x1c29f4;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_a18 = (long)iVar1;
  lStack_a20 = 0;
  if (lStack_a18 == 0) {
    puStack_a28 = (uv_process_options_t *)0x1c2a17;
    uVar4 = uv_default_loop();
    puStack_a28 = (uv_process_options_t *)0x1c2a21;
    iVar1 = uv_run(uVar4,0);
    lStack_a18 = (long)iVar1;
    lStack_a20 = 0;
    if (lStack_a18 != 0) goto LAB_001c2b32;
    puStack_a28 = (uv_process_options_t *)0x1c2a4b;
    iVar1 = uv_is_closing(&process);
    lStack_a18 = (long)iVar1;
    lStack_a20 = 0;
    if (lStack_a18 != 0) goto LAB_001c2b3f;
    puStack_a28 = (uv_process_options_t *)0x1c2a77;
    uv_close(&process,0);
    puStack_a28 = (uv_process_options_t *)0x1c2a7c;
    uVar4 = uv_default_loop();
    puStack_a28 = (uv_process_options_t *)0x1c2a86;
    iVar1 = uv_run(uVar4,0);
    lStack_a18 = (long)iVar1;
    lStack_a20 = 0;
    if (lStack_a18 != 0) goto LAB_001c2b4c;
    lStack_a18 = 1;
    puStack_a28 = (uv_process_options_t *)0x1c2ab9;
    iVar1 = uv_is_closing(&process);
    lStack_a20 = (long)iVar1;
    if (lStack_a18 != lStack_a20) goto LAB_001c2b59;
    puStack_a28 = (uv_process_options_t *)0x1c2ad3;
    __ptr = (uv_process_options_t *)uv_default_loop();
    puStack_a28 = (uv_process_options_t *)0x1c2ae7;
    uv_walk(__ptr,close_walk_cb,0);
    puStack_a28 = (uv_process_options_t *)0x1c2af1;
    uv_run(__ptr,0);
    lStack_a18 = 0;
    puStack_a28 = (uv_process_options_t *)0x1c2aff;
    uVar4 = uv_default_loop();
    puStack_a28 = (uv_process_options_t *)0x1c2b07;
    iVar1 = uv_loop_close(uVar4);
    lStack_a20 = (long)iVar1;
    if (lStack_a18 == lStack_a20) {
      puStack_a28 = (uv_process_options_t *)0x1c2b1d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a28 = (uv_process_options_t *)0x1c2b32;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b32:
    puStack_a28 = (uv_process_options_t *)0x1c2b3f;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b3f:
    puStack_a28 = (uv_process_options_t *)0x1c2b4c;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b4c:
    puStack_a28 = (uv_process_options_t *)0x1c2b59;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b59:
    puStack_a28 = (uv_process_options_t *)0x1c2b66;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_a28 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_e88 = 0x6c756e2f7665642f;
  uStack_e80 = 0x6c;
  aStack_a30 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  puStack_a28 = __s;
  iVar1 = uv_fs_open(0,auStack_bf0,&uStack_e88,2,0,0);
  ap_Stack_cd8[0] = (uv_exit_cb)(long)iVar1;
  alStack_da0[0] = 0;
  if (ap_Stack_cd8[0] == (uv_exit_cb)0x0) {
    iStack_ea0 = iStack_b98;
    init_process_options("spawn_helper8",exit_cb);
    uVar4 = uv_default_loop();
    __ptr = (uv_process_options_t *)ap_Stack_cd8;
    iVar1 = uv_pipe_init(uVar4,__ptr,0);
    alStack_da0[0] = (long)iVar1;
    alStack_e68[0] = 0;
    if (alStack_da0[0] != 0) goto LAB_001c2e8a;
    options.stdio = &uStack_e78;
    uStack_e78.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_e78.data.stream = (uv_stream_t *)__ptr;
    iStack_e9c = dup(iStack_ea0);
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    alStack_da0[0] = (long)iVar1;
    alStack_e68[0] = 0;
    if (alStack_da0[0] != 0) goto LAB_001c2e9c;
    auStack_e98 = uv_buf_init(&iStack_ea0,4);
    iVar1 = uv_write(alStack_da0,ap_Stack_cd8,auStack_e98,1,write_null_cb);
    alStack_e68[0] = (long)iVar1;
    if (alStack_e68[0] != 0) goto LAB_001c2eae;
    auVar14 = uv_buf_init(&iStack_e9c,4);
    auStack_e98 = auVar14;
    iVar1 = uv_write(alStack_e68,ap_Stack_cd8,auStack_e98,1,write_cb);
    lStack_ea8 = 0;
    if (iVar1 != 0) goto LAB_001c2ebd;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    lStack_ea8 = 0;
    if (iVar1 != 0) goto LAB_001c2ecc;
    iVar1 = uv_fs_close(0,auStack_bf0,iStack_ea0,0);
    lStack_ea8 = 0;
    if (iVar1 != 0) goto LAB_001c2edb;
    lStack_ea8 = (long)exit_cb_called;
    if (lStack_ea8 != 1) goto LAB_001c2eea;
    lStack_ea8 = (long)close_cb_called;
    if (lStack_ea8 != 2) goto LAB_001c2ef9;
    __ptr = (uv_process_options_t *)uv_default_loop();
    uv_walk(__ptr,close_walk_cb,0);
    uv_run(__ptr,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    lStack_ea8 = (long)iVar1;
    if (lStack_ea8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2e8a:
    run_test_spawn_fs_open_cold_2();
LAB_001c2e9c:
    run_test_spawn_fs_open_cold_3();
LAB_001c2eae:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ebd:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ecc:
    run_test_spawn_fs_open_cold_6();
LAB_001c2edb:
    run_test_spawn_fs_open_cold_7();
LAB_001c2eea:
    run_test_spawn_fs_open_cold_8();
LAB_001c2ef9:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_ea8;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_ee0 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  auStack_11f0._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_11f0 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_f18;
    uStack_f18.flags = UV_INHERIT_FD;
    uStack_f18.data.file = auStack_11f0._16_4_;
    uStack_f08 = 0;
    uStack_ef8 = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    apuStack_11c0[0] = (uv_handle_t *)(long)iVar1;
    auStack_1000[0] = 0;
    if (apuStack_11c0[0] != (uv_handle_t *)0x0) goto LAB_001c33c5;
    uv_unref(&process);
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,auStack_1000,0);
    apuStack_11c0[0] = (uv_handle_t *)(long)iVar1;
    auStack_11f0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_11c0[0] != (uv_handle_t *)0x0) goto LAB_001c33d7;
    iVar1 = uv_pipe_open(auStack_1000,auStack_11f0._16_4_);
    apuStack_11c0[0] = (uv_handle_t *)(long)iVar1;
    auStack_11f0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_11c0[0] != (uv_handle_t *)0x0) goto LAB_001c33e6;
    auStack_11f0._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_1000,on_alloc,on_read_once);
    apuStack_11c0[0] = (uv_handle_t *)(long)iVar1;
    auStack_11f0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_11c0[0] != (uv_handle_t *)0x0) goto LAB_001c33f5;
    auStack_11f0._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_11c0,auStack_11f0._20_4_,auStack_11f0 + 0x18,1,0xffffffffffffffff
                        ,0);
    auStack_11f0._8_8_ = SEXT48(iVar1);
    if (auStack_11f0._0_8_ != auStack_11f0._8_8_) goto LAB_001c3404;
    auStack_11f0._0_8_ = (uv_loop_t *)0x1;
    auStack_11f0._8_8_ = puStack_1168;
    if (puStack_1168 != (uv_loop_t *)0x1) goto LAB_001c3413;
    uv_fs_req_cleanup(apuStack_11c0);
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    auStack_11f0._0_8_ = SEXT48(iVar1);
    auStack_11f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_11f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3422;
    auStack_11f0._0_8_ = (uv_loop_t *)0x1;
    auStack_11f0._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_11f0._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3431;
    uv_close(auStack_1000,close_cb);
    auStack_11f0._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_11c0,auStack_11f0._20_4_,auStack_11f0 + 0x18,1,0xffffffffffffffff
                        ,0);
    auStack_11f0._8_8_ = SEXT48(iVar1);
    if (auStack_11f0._0_8_ != auStack_11f0._8_8_) goto LAB_001c3440;
    auStack_11f0._0_8_ = (uv_loop_t *)0x1;
    auStack_11f0._8_8_ = puStack_1168;
    if (puStack_1168 != (uv_loop_t *)0x1) goto LAB_001c344f;
    uv_fs_req_cleanup(apuStack_11c0);
    uVar4 = uv_default_loop();
    iVar1 = uv_timer_init(uVar4,&timer);
    auStack_11f0._0_8_ = SEXT48(iVar1);
    auStack_11f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_11f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c345e;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_11f0._0_8_ = SEXT48(iVar1);
    auStack_11f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_11f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c346d;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    if (iVar1 == 1) {
      uVar4 = uv_default_loop();
      iVar1 = uv_run(uVar4,1);
      auStack_11f0._0_8_ = SEXT48(iVar1);
      auStack_11f0._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_11f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b8;
    }
    auStack_11f0._0_8_ = (uv_loop_t *)0x1;
    auStack_11f0._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_11f0._8_8_ != (uv_loop_t *)0x1) goto LAB_001c347c;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_11f0._0_8_ = SEXT48(iVar1);
    auStack_11f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_11f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c348b;
    iVar1 = close(auStack_11f0._20_4_);
    auStack_11f0._0_8_ = SEXT48(iVar1);
    auStack_11f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_11f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c349a;
    auStack_11f0._20_4_ = -1;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    auStack_11f0._0_8_ = (uv_loop_t *)0x0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    auStack_11f0._8_8_ = SEXT48(iVar1);
    if (auStack_11f0._0_8_ == auStack_11f0._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33c5:
    run_test_closed_fd_events_cold_2();
LAB_001c33d7:
    run_test_closed_fd_events_cold_3();
LAB_001c33e6:
    run_test_closed_fd_events_cold_4();
LAB_001c33f5:
    run_test_closed_fd_events_cold_5();
LAB_001c3404:
    run_test_closed_fd_events_cold_6();
LAB_001c3413:
    run_test_closed_fd_events_cold_7();
LAB_001c3422:
    run_test_closed_fd_events_cold_8();
LAB_001c3431:
    run_test_closed_fd_events_cold_9();
LAB_001c3440:
    run_test_closed_fd_events_cold_10();
LAB_001c344f:
    run_test_closed_fd_events_cold_11();
LAB_001c345e:
    run_test_closed_fd_events_cold_12();
LAB_001c346d:
    run_test_closed_fd_events_cold_13();
LAB_001c347c:
    run_test_closed_fd_events_cold_15();
LAB_001c348b:
    run_test_closed_fd_events_cold_16();
LAB_001c349a:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34b8:
  tcp = (uv_stream_t *)auStack_11f0;
  puVar5 = auStack_11f0 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)puVar5,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_and_ping) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_OK(strcmp(output, "TEST"));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}